

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Explosion.cpp
# Opt level: O0

void __thiscall Explosion::render(Explosion *this,int offx,int offy)

{
  void *pvVar1;
  int in_EDX;
  int in_ESI;
  ResourceManager *in_RDI;
  int bitmapIndex;
  ALLEGRO_BITMAP *bitmap;
  ResourceManager *rm;
  int in_stack_ffffffffffffffcc;
  
  ResourceManager::getInstance();
  pvVar1 = ResourceManager::getData(in_RDI,in_stack_ffffffffffffffcc);
  al_draw_rotated_bitmap
            (*(undefined4 *)
              &(in_RDI->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
             *(undefined4 *)
              &(in_RDI->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
             (float)in_ESI +
             *(float *)&(in_RDI->resources).
                        super__Vector_base<Resource_*,_std::allocator<Resource_*>_>._M_impl.
                        super__Vector_impl_data._M_finish,
             (float)in_EDX +
             *(float *)((long)&(in_RDI->resources).
                               super__Vector_base<Resource_*,_std::allocator<Resource_*>_>._M_impl.
                               super__Vector_impl_data._M_finish + 4),0,pvVar1,0);
  return;
}

Assistant:

void Explosion::render(int offx, int offy)
{
   ResourceManager& rm = ResourceManager::getInstance();
   ALLEGRO_BITMAP *bitmap;
   int bitmapIndex;

   if (big)
      bitmapIndex = RES_LARGEEXPLOSION0 + currFrame;
   else
      bitmapIndex = RES_SMALLEXPLOSION0 + currFrame;

   bitmap = (ALLEGRO_BITMAP *)rm.getData(bitmapIndex);

   al_draw_rotated_bitmap(bitmap, radius, radius, offx + x, offy + y, 0, 0);
}